

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftOffRequest.h
# Opt level: O3

bool __thiscall ShiftOffRequest::operator==(ShiftOffRequest *this,ShiftOffRequest *shiftOffRequest)

{
  size_t sVar1;
  int iVar2;
  string *psVar3;
  bool bVar4;
  
  psVar3 = getNurse_abi_cxx11_(shiftOffRequest);
  sVar1 = (this->nurse)._M_string_length;
  if (sVar1 == psVar3->_M_string_length) {
    if (sVar1 == 0) {
      return true;
    }
    iVar2 = bcmp((this->nurse)._M_dataplus._M_p,(psVar3->_M_dataplus)._M_p,sVar1);
    if (iVar2 == 0) {
      return true;
    }
  }
  psVar3 = getDay_abi_cxx11_(shiftOffRequest);
  sVar1 = (this->day)._M_string_length;
  if (sVar1 == psVar3->_M_string_length) {
    if (sVar1 == 0) {
      return true;
    }
    iVar2 = bcmp((this->day)._M_dataplus._M_p,(psVar3->_M_dataplus)._M_p,sVar1);
    if (iVar2 == 0) {
      return true;
    }
  }
  psVar3 = getShiftType_abi_cxx11_(shiftOffRequest);
  sVar1 = (this->shiftType)._M_string_length;
  if (sVar1 == psVar3->_M_string_length) {
    if (sVar1 == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp((this->shiftType)._M_dataplus._M_p,(psVar3->_M_dataplus)._M_p,sVar1);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator== (const ShiftOffRequest& shiftOffRequest) {
        return nurse ==shiftOffRequest.getNurse() ||  day == shiftOffRequest.getDay() || shiftType ==shiftOffRequest.getShiftType();
    }